

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::AssertPred3Helper<bool(*)(int,int,int),int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          char *expr2,char *expr3,_func_bool_int_int_int *pred,int val1,int val2,int val3)

{
  char cVar1;
  AssertionResult *pAVar2;
  char *local_50;
  char *local_48;
  char *local_40;
  iutest *local_38;
  AssertionResult local_30;
  
  local_50 = expr2;
  local_48 = expr1;
  local_40 = pred_str;
  local_38 = this;
  cVar1 = (*(code *)expr3)((ulong)pred & 0xffffffff,val1,val2);
  if (cVar1 == '\0') {
    local_30.m_message._M_dataplus._M_p = (pointer)&local_30.m_message.field_2;
    local_30.m_message._M_string_length = 0;
    local_30.m_message.field_2._M_local_buf[0] = '\0';
    local_30.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_30,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&local_38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x201752);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&pred);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val1);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val2);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred3Helper(const char* pred_str
    , const char* expr1, const char* expr2, const char* expr3
    , PRED pred, T1 val1, T2 val2, T3 val3)
{
    if IUTEST_COND_LIKELY( (*pred)(val1, val2, val3) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << expr1 << ", " << expr2 << ", " << expr3
        << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1
        << "\n" << expr2 << " : " << val2
        << "\n" << expr3 << " : " << val3;
}